

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int load_aux(lua_State *L,int status,int envidx)

{
  char *pcVar1;
  int iVar2;
  
  if (status == 0) {
    if (envidx == 0) {
      iVar2 = 1;
    }
    else {
      lua_pushvalue(L,envidx);
      iVar2 = 1;
      pcVar1 = lua_setupvalue(L,-2,1);
      if (pcVar1 == (char *)0x0) {
        lua_settop(L,-2);
      }
    }
  }
  else {
    lua_pushnil(L);
    lua_insert(L,-2);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int load_aux (lua_State *L, int status, int envidx) {
  if (status == LUA_OK) {
    if (envidx != 0) {  /* 'env' parameter? */
      lua_pushvalue(L, envidx);  /* environment for loaded function */
      if (!lua_setupvalue(L, -2, 1))  /* set it as 1st upvalue */
        lua_pop(L, 1);  /* remove 'env' if not used by previous call */
    }
    return 1;
  }
  else {  /* error (message is on top of the stack) */
    lua_pushnil(L);
    lua_insert(L, -2);  /* put before error message */
    return 2;  /* return nil plus error message */
  }
}